

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

Reader __thiscall
capnp::List<capnp::Text,_(capnp::Kind)1>::Reader::operator[](Reader *this,uint index)

{
  uint uVar1;
  uint index_00;
  StringPtr SVar2;
  PointerReader local_48;
  uint local_24;
  Reader *pRStack_20;
  uint index_local;
  Reader *this_local;
  
  local_24 = index;
  pRStack_20 = this;
  uVar1 = size(this);
  if (index < uVar1) {
    index_00 = bounded<unsigned_int>(local_24);
    _::ListReader::getPointerElement(&local_48,&this->reader,index_00);
    SVar2.content =
         (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_48,(void *)0x0,0);
    return (StringPtr)(StringPtr)SVar2.content;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/list.h"
             ,0x1c9,"index < size()","",(char *)0x0);
}

Assistant:

inline typename T::Reader operator[](uint index) const {
      KJ_IREQUIRE(index < size());
      return reader.getPointerElement(bounded(index) * ELEMENTS)
          .template getBlob<T>(nullptr, ZERO * BYTES);
    }